

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  uint uVar4;
  int iVar5;
  ImGuiContextHook *pIVar6;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var7;
  ImGuiViewportP *pIVar8;
  char *__s1;
  ImGuiWindow **ppIVar9;
  unsigned_short *puVar10;
  bool bVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiContext *pIVar14;
  ImGuiID key;
  int iVar15;
  ImVec2 in_RAX;
  ImGuiContext *g_6;
  ImGuiWindow *pIVar16;
  ImGuiWindow **ppIVar17;
  unsigned_short *__dest;
  byte bVar18;
  char *pcVar19;
  char *label;
  ImGuiContext *g;
  byte bVar20;
  ImGuiDir IVar21;
  uint uVar22;
  ImGuiContext *g_1;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  ImVec2 local_38;
  
  pIVar13 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  iVar15 = (GImGui->Hooks).Size;
  local_38 = in_RAX;
  if (0 < iVar15) {
    lVar24 = 0;
    lVar25 = 0;
    do {
      pIVar6 = (pIVar13->Hooks).Data;
      if (*(int *)(pIVar6 + lVar24 + 4) == 2) {
        (**(code **)(pIVar6 + lVar24 + 0x10))();
        iVar15 = (pIVar13->Hooks).Size;
      }
      lVar25 = lVar25 + 1;
      lVar24 = lVar24 + 0x20;
    } while (lVar25 < iVar15);
  }
  pIVar12 = GImGui;
  iVar15 = (GImGui->CurrentWindowStack).Size;
  while (1 < iVar15) {
    End();
    iVar15 = (pIVar12->CurrentWindowStack).Size;
  }
  p_Var7 = (pIVar13->IO).SetPlatformImeDataFn;
  if ((p_Var7 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar31[0] = -((pIVar13->PlatformImeDataPrev).WantVisible ==
                    (pIVar13->PlatformImeData).WantVisible),
     auVar31[1] = -((pIVar13->PlatformImeDataPrev).field_0x1 == (pIVar13->PlatformImeData).field_0x1
                   ),
     auVar31[2] = -((pIVar13->PlatformImeDataPrev).field_0x2 == (pIVar13->PlatformImeData).field_0x2
                   ),
     auVar31[3] = -((pIVar13->PlatformImeDataPrev).field_0x3 == (pIVar13->PlatformImeData).field_0x3
                   ),
     auVar31[4] = -(*(char *)&(pIVar13->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(pIVar13->PlatformImeData).InputPos.x),
     auVar31[5] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(pIVar13->PlatformImeData).InputPos.x + 1)),
     auVar31[6] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(pIVar13->PlatformImeData).InputPos.x + 2)),
     auVar31[7] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(pIVar13->PlatformImeData).InputPos.x + 3)),
     auVar31[8] = -(*(char *)&(pIVar13->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(pIVar13->PlatformImeData).InputPos.y),
     auVar31[9] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(pIVar13->PlatformImeData).InputPos.y + 1)),
     auVar31[10] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(pIVar13->PlatformImeData).InputPos.y + 2)),
     auVar31[0xb] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(pIVar13->PlatformImeData).InputPos.y + 3)),
     auVar31[0xc] = -(*(char *)&(pIVar13->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(pIVar13->PlatformImeData).InputLineHeight),
     auVar31[0xd] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(pIVar13->PlatformImeData).InputLineHeight + 1)),
     auVar31[0xe] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(pIVar13->PlatformImeData).InputLineHeight + 2)),
     auVar31[0xf] = -(*(char *)((long)&(pIVar13->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(pIVar13->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf)
     != 0xffff)) {
    (*p_Var7)(&(*(GImGui->Viewports).Data)->super_ImGuiViewport,&pIVar13->PlatformImeData);
  }
  pIVar13->WithinFrameScopeWithImplicitWindow = false;
  pIVar16 = pIVar13->CurrentWindow;
  if ((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->WriteAccessed == false)) {
    pIVar16->Active = false;
  }
  End();
  pIVar12 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar16 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar12->WindowsById,key);
      pIVar12->NavWindowingListWindow = pIVar16;
    }
    pIVar8 = *(pIVar12->Viewports).Data;
    IVar2 = (pIVar8->super_ImGuiViewport).Size;
    IVar29.x = IVar2.x * 0.2;
    IVar29.y = IVar2.y * 0.2;
    (pIVar12->NextWindowData).SizeConstraintRect.Min = IVar29;
    (pIVar12->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar12->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar12->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar12->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = (pIVar8->super_ImGuiViewport).Pos;
    IVar29 = (pIVar8->super_ImGuiViewport).Size;
    (pIVar12->NextWindowData).Flags = (pIVar12->NextWindowData).Flags | 0x11;
    (pIVar12->NextWindowData).PosVal.x = IVar29.x * 0.5 + IVar2.x;
    (pIVar12->NextWindowData).PosVal.y = IVar29.y * 0.5 + IVar2.y;
    (pIVar12->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar12->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar12->NextWindowData).PosCond = 1;
    IVar2 = (pIVar12->Style).WindowPadding;
    fVar27 = IVar2.x;
    fVar28 = IVar2.y;
    local_38.x = fVar27 + fVar27;
    local_38.y = fVar28 + fVar28;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar24 = (long)(pIVar12->WindowsFocusOrder).Size;
    if (0 < lVar24) {
      do {
        pIVar16 = (pIVar12->WindowsFocusOrder).Data[lVar24 + -1];
        if (((pIVar16->WasActive == true) && (pIVar16->RootWindow == pIVar16)) &&
           (uVar22 = pIVar16->Flags, (uVar22 >> 0x13 & 1) == 0)) {
          __s1 = pIVar16->Name;
          pcVar19 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00116e75:
            label = "(Popup)";
            if ((uVar22 >> 0x1a & 1) == 0) {
              if ((uVar22 >> 10 & 1) != 0) {
                iVar15 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar15 == 0) goto LAB_00116ea2;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar19 == '#') {
                if (pcVar19[1] == '#') goto LAB_00116e6b;
              }
              else if (*pcVar19 == '\0') goto LAB_00116e6b;
              pcVar19 = pcVar19 + 1;
            } while (pcVar19 != (char *)0xffffffffffffffff);
            pcVar19 = (char *)0xffffffffffffffff;
LAB_00116e6b:
            label = __s1;
            if (__s1 == pcVar19) goto LAB_00116e75;
          }
LAB_00116ea2:
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(label,pIVar12->NavWindowingTarget == pIVar16,0,&local_38);
        }
        bVar11 = 1 < lVar24;
        lVar24 = lVar24 + -1;
      } while (bVar11);
    }
    End();
    PopStyleVar(1);
  }
  pIVar14 = GImGui;
  if (((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (GImGui->NavMoveScoringItems == true)) &&
     (((GImGui->NavMoveResultLocal).ID == 0 &&
      (((GImGui->NavMoveResultOther).ID == 0 &&
       (-1 < (char)pIVar12->NavMoveFlags && (pIVar12->NavMoveFlags & 0xfU) != 0)))))) {
    pIVar16 = GImGui->NavWindow;
    IVar3 = GImGui->NavLayer;
    fVar28 = pIVar16->NavRectRel[IVar3].Min.y;
    fVar27 = pIVar16->NavRectRel[IVar3].Max.y;
    iVar15 = GImGui->NavMoveDir;
    uVar22 = GImGui->NavMoveFlags;
    if (iVar15 == 0) {
      if ((uVar22 & 5) == 0) goto LAB_001170d0;
      fVar32 = (pIVar16->ContentSize).x + (pIVar16->WindowPadding).x;
      IVar21 = 0;
      fVar30 = fVar32;
      if ((uVar22 & 4) != 0) {
        fVar33 = fVar27 - fVar28;
        fVar27 = fVar27 - fVar33;
        IVar21 = 2;
        fVar28 = fVar28 - fVar33;
      }
    }
    else if ((uVar22 & 5) == 0 || iVar15 != 1) {
      fVar30 = pIVar16->NavRectRel[IVar3].Min.x;
      fVar32 = pIVar16->NavRectRel[IVar3].Max.x;
      if ((uVar22 & 10) == 0 || iVar15 != 2) {
        if (iVar15 != 3 || (uVar22 & 10) == 0) goto LAB_001170d0;
        fVar27 = -(pIVar16->WindowPadding).y;
        IVar21 = 3;
        fVar28 = fVar27;
        if ((uVar22 & 8) != 0) {
          fVar33 = fVar32 - fVar30;
          fVar30 = fVar30 + fVar33;
          fVar32 = fVar32 + fVar33;
          IVar21 = 1;
        }
      }
      else {
        fVar27 = (pIVar16->ContentSize).y + (pIVar16->WindowPadding).y;
        IVar21 = 2;
        fVar28 = fVar27;
        if ((uVar22 & 8) != 0) {
          fVar33 = fVar32 - fVar30;
          fVar30 = fVar30 - fVar33;
          fVar32 = fVar32 - fVar33;
          IVar21 = 0;
        }
      }
    }
    else {
      fVar32 = -(pIVar16->WindowPadding).x;
      IVar21 = 1;
      fVar30 = fVar32;
      if ((uVar22 & 4) != 0) {
        fVar33 = fVar27 - fVar28;
        fVar27 = fVar27 + fVar33;
        IVar21 = 3;
        fVar28 = fVar28 + fVar33;
      }
    }
    pIVar16->NavRectRel[IVar3].Min.x = fVar30;
    pIVar16->NavRectRel[IVar3].Min.y = fVar28;
    pIVar16->NavRectRel[IVar3].Max.x = fVar32;
    pIVar16->NavRectRel[IVar3].Max.y = fVar27;
    pIVar14->NavMoveScoringItems = false;
    pIVar14->NavMoveForwardToNextFrame = true;
    pIVar14->NavMoveSubmitted = false;
    pIVar14->NavAnyRequest = pIVar14->NavInitRequest;
    pIVar14->NavMoveClipDir = IVar21;
    pIVar14->NavMoveFlags = uVar22 | 0x80;
  }
LAB_001170d0:
  bVar18 = pIVar13->DragDropActive;
  iVar15 = pIVar13->FrameCount;
  if ((bool)bVar18 != true) goto LAB_00117134;
  if ((pIVar13->DragDropPayload).DataFrameCount + 1 < iVar15) {
    if ((pIVar13->DragDropSourceFlags & 0x20) == 0) {
      bVar20 = (GImGui->IO).MouseDown[pIVar13->DragDropMouseButton] ^ 1;
      goto LAB_0011711a;
    }
  }
  else {
    bVar20 = 0;
LAB_0011711a:
    if ((bVar20 == 0) && ((pIVar13->DragDropPayload).Delivery == false)) goto LAB_00117134;
  }
  ClearDragDrop();
  bVar18 = pIVar13->DragDropActive;
  iVar15 = pIVar13->FrameCount;
LAB_00117134:
  if ((((bVar18 & 1) != 0) && (pIVar13->DragDropSourceFrameCount < iVar15)) &&
     ((pIVar13->DragDropSourceFlags & 1) == 0)) {
    pIVar13->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar13->DragDropWithinSource = false;
    iVar15 = pIVar13->FrameCount;
  }
  pIVar13->WithinFrameScope = false;
  pIVar13->FrameCountEnded = iVar15;
  UpdateMouseMovingWindowEndFrame();
  uVar22 = (pIVar13->WindowsTempSortBuffer).Capacity;
  if ((int)uVar22 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar22 = 0;
    ppIVar17 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar13->WindowsTempSortBuffer).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar17,ppIVar9,(long)(pIVar13->WindowsTempSortBuffer).Size << 3);
      ppIVar9 = (pIVar13->WindowsTempSortBuffer).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar13->WindowsTempSortBuffer).Data = ppIVar17;
    (pIVar13->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar13->WindowsTempSortBuffer).Size = 0;
  uVar4 = (pIVar13->Windows).Size;
  uVar26 = (ulong)uVar4;
  if ((int)uVar22 < (int)uVar4) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar17 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar26 * 8,GImAllocatorUserData);
    ppIVar9 = (pIVar13->WindowsTempSortBuffer).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar17,ppIVar9,(long)(pIVar13->WindowsTempSortBuffer).Size << 3);
      ppIVar9 = (pIVar13->WindowsTempSortBuffer).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar13->WindowsTempSortBuffer).Data = ppIVar17;
    (pIVar13->WindowsTempSortBuffer).Capacity = uVar4;
    uVar26 = (ulong)(uint)(pIVar13->Windows).Size;
    uVar22 = uVar4;
  }
  if ((int)uVar26 == 0) {
    iVar15 = 0;
  }
  else {
    uVar23 = 0;
    do {
      pIVar16 = (pIVar13->Windows).Data[uVar23];
      if ((pIVar16->Active != true) || ((pIVar16->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar13->WindowsTempSortBuffer,pIVar16);
        uVar26 = (ulong)(uint)(pIVar13->Windows).Size;
      }
      uVar23 = uVar23 + 1;
      iVar15 = (int)uVar26;
    } while (uVar23 != uVar26);
    uVar22 = (pIVar13->WindowsTempSortBuffer).Capacity;
  }
  iVar5 = (pIVar13->WindowsTempSortBuffer).Size;
  (pIVar13->WindowsTempSortBuffer).Size = iVar15;
  (pIVar13->Windows).Size = iVar5;
  (pIVar13->WindowsTempSortBuffer).Capacity = (pIVar13->Windows).Capacity;
  (pIVar13->Windows).Capacity = uVar22;
  ppIVar9 = (pIVar13->WindowsTempSortBuffer).Data;
  (pIVar13->WindowsTempSortBuffer).Data = (pIVar13->Windows).Data;
  (pIVar13->Windows).Data = ppIVar9;
  (pIVar13->IO).MetricsActiveWindows = pIVar13->WindowsActiveCount;
  ((pIVar13->IO).Fonts)->Locked = false;
  (pIVar13->IO).MouseWheel = 0.0;
  (pIVar13->IO).MouseWheelH = 0.0;
  if ((pIVar13->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar10 = (pIVar13->IO).InputQueueCharacters.Data;
    if (puVar10 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar10,(long)(pIVar13->IO).InputQueueCharacters.Size * 2);
      puVar10 = (pIVar13->IO).InputQueueCharacters.Data;
      if ((puVar10 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
    }
    (pIVar13->IO).InputQueueCharacters.Data = __dest;
    (pIVar13->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar13->IO).InputQueueCharacters.Size = 0;
  (pIVar13->IO).NavInputs[0] = 0.0;
  (pIVar13->IO).NavInputs[1] = 0.0;
  (pIVar13->IO).NavInputs[2] = 0.0;
  (pIVar13->IO).NavInputs[3] = 0.0;
  (pIVar13->IO).NavInputs[4] = 0.0;
  (pIVar13->IO).NavInputs[5] = 0.0;
  (pIVar13->IO).NavInputs[6] = 0.0;
  (pIVar13->IO).NavInputs[7] = 0.0;
  (pIVar13->IO).NavInputs[8] = 0.0;
  (pIVar13->IO).NavInputs[9] = 0.0;
  (pIVar13->IO).NavInputs[10] = 0.0;
  (pIVar13->IO).NavInputs[0xb] = 0.0;
  (pIVar13->IO).NavInputs[0xc] = 0.0;
  (pIVar13->IO).NavInputs[0xd] = 0.0;
  (pIVar13->IO).NavInputs[0xe] = 0.0;
  (pIVar13->IO).NavInputs[0xf] = 0.0;
  (pIVar13->IO).NavInputs[0x10] = 0.0;
  (pIVar13->IO).NavInputs[0x11] = 0.0;
  (pIVar13->IO).NavInputs[0x12] = 0.0;
  (pIVar13->IO).NavInputs[0x13] = 0.0;
  iVar15 = (pIVar13->Hooks).Size;
  if (0 < iVar15) {
    lVar24 = 0;
    lVar25 = 0;
    do {
      pIVar6 = (pIVar13->Hooks).Data;
      if (*(int *)(pIVar6 + lVar24 + 4) == 3) {
        (**(code **)(pIVar6 + lVar24 + 0x10))(pIVar13,pIVar6 + lVar24);
        iVar15 = (pIVar13->Hooks).Size;
      }
      lVar25 = lVar25 + 1;
      lVar24 = lVar24 + 0x20;
    } while (lVar25 < iVar15);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}